

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O2

bool __thiscall crnlib::threaded_resampler::resample(threaded_resampler *this,params *p)

{
  params *ppVar1;
  task_pool *ptVar2;
  bool bVar3;
  uint uVar4;
  Contrib_List *pCVar5;
  uint i_1;
  long lVar6;
  uint i;
  void *pData_ptr;
  
  free_contrib_lists(this);
  this->m_pParams = p;
  if ((ulong)p->m_fmt < 3) {
    this->m_bytes_per_pixel = *(uint *)(&DAT_00189eec + (ulong)p->m_fmt * 4);
    uVar4 = find_resample_filter(p->m_Pfilter_name);
    if (-1 < (int)uVar4) {
      lVar6 = (ulong)uVar4 * 0x30;
      ppVar1 = this->m_pParams;
      pCVar5 = Resampler::make_clist
                         (ppVar1->m_src_width,ppVar1->m_dst_width,ppVar1->m_boundary_op,
                          *(_func_Resample_Real_Resample_Real **)(&DAT_001b9ac0 + lVar6),
                          *(Resample_Real *)(&DAT_001b9ac8 + lVar6),p->m_filter_x_scale,0.0);
      this->m_pX_contribs = pCVar5;
      if (pCVar5 != (Contrib_List *)0x0) {
        ppVar1 = this->m_pParams;
        pCVar5 = Resampler::make_clist
                           (ppVar1->m_src_height,ppVar1->m_dst_height,ppVar1->m_boundary_op,
                            *(_func_Resample_Real_Resample_Real **)(&DAT_001b9ac0 + lVar6),
                            *(Resample_Real *)(&DAT_001b9ac8 + lVar6),p->m_filter_y_scale,0.0);
        this->m_pY_contribs = pCVar5;
        if (pCVar5 != (Contrib_List *)0x0) {
          pData_ptr = (void *)0x0;
          bVar3 = vector<crnlib::vec<4U,_float>_>::try_resize
                            (&this->m_tmp_img,
                             this->m_pParams->m_src_height * this->m_pParams->m_dst_width,false);
          if (bVar3) {
            while( true ) {
              ptVar2 = this->m_pTask_pool;
              if (ptVar2->m_num_threads < (uint)pData_ptr) break;
              task_pool::
              queue_object_task<crnlib::threaded_resampler,void(crnlib::threaded_resampler::*)(unsigned_long_long,void*)>
                        (ptVar2,this,0x13936a,0,pData_ptr);
              pData_ptr = (void *)(ulong)((uint)pData_ptr + 1);
            }
            task_pool::join(ptVar2);
            for (uVar4 = 0; ptVar2 = this->m_pTask_pool, uVar4 <= ptVar2->m_num_threads;
                uVar4 = uVar4 + 1) {
              task_pool::
              queue_object_task<crnlib::threaded_resampler,void(crnlib::threaded_resampler::*)(unsigned_long_long,void*)>
                        (ptVar2,this,0x139644,0,(void *)(ulong)uVar4);
            }
            task_pool::join(ptVar2);
            vector<crnlib::vec<4U,_float>_>::clear(&this->m_tmp_img);
            free_contrib_lists(this);
            pData_ptr = (void *)0x1;
          }
          goto LAB_00139a8e;
        }
      }
    }
  }
  pData_ptr = (void *)0x0;
LAB_00139a8e:
  return SUB81(pData_ptr,0);
}

Assistant:

bool threaded_resampler::resample(const params& p)
    {
        free_contrib_lists();

        m_pParams = &p;

        CRNLIB_ASSERT(m_pParams->m_src_width && m_pParams->m_src_height);
        CRNLIB_ASSERT(m_pParams->m_dst_width && m_pParams->m_dst_height);

        switch (p.m_fmt)
        {
        case cPF_Y_F32:
            m_bytes_per_pixel = 4;
            break;
        case cPF_RGBX_F32:
        case cPF_RGBA_F32:
            m_bytes_per_pixel = 16;
            break;
        default:
            CRNLIB_ASSERT(false);
            return false;
        }

        int filter_index = find_resample_filter(p.m_Pfilter_name);
        if (filter_index < 0)
        {
            return false;
        }

        const resample_filter& filter = g_resample_filters[filter_index];

        m_pX_contribs = Resampler::make_clist(m_pParams->m_src_width, m_pParams->m_dst_width, m_pParams->m_boundary_op,
            filter.func, filter.support, p.m_filter_x_scale, 0.0f);
        if (!m_pX_contribs)
        {
            return false;
        }

        m_pY_contribs = Resampler::make_clist(m_pParams->m_src_height, m_pParams->m_dst_height,
            m_pParams->m_boundary_op, filter.func, filter.support, p.m_filter_y_scale,
            0.0f);
        if (!m_pY_contribs)
        {
            return false;
        }

        if (!m_tmp_img.try_resize(m_pParams->m_dst_width * m_pParams->m_src_height))
        {
            return false;
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &threaded_resampler::resample_x_task, i, nullptr);
        }
        m_pTask_pool->join();

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &threaded_resampler::resample_y_task, i, nullptr);
        }
        m_pTask_pool->join();

        m_tmp_img.clear();
        free_contrib_lists();

        return true;
    }